

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry * NscBuildCase(int nToken,CNscPStackEntry *pCond)

{
  NscType NVar1;
  CNwnDoubleLinkList *pCVar2;
  CNscPStackEntry *pCVar3;
  anon_union_8_2_ecfd7102_for_NscSymbolFence_9 this;
  iterator __position;
  CNscPStackEntry *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  CNwnDoubleLinkList *pNext;
  char *pcVar5;
  CNwnDoubleLinkList *pCVar6;
  CNscContext *pCVar7;
  NscPCodeHeader *pv;
  size_t *psVar8;
  NscSymbolFence *pNVar9;
  byte bVar10;
  int nCaseValue;
  uint local_4c;
  size_t *local_48;
  size_t local_40;
  size_t local_38;
  
  this_00 = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar7 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pCond != (CNscPStackEntry *)0x0) {
      pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar3 = (CNscPStackEntry *)(pCond->m_link).m_pNext;
      if (pCVar3 != pCond) {
        pCVar6 = (pCond->m_link).m_pPrev;
        (pCVar3->m_link).m_pPrev = pCVar6;
        pCVar6->m_pNext = (CNwnDoubleLinkList *)pCVar3;
        (pCond->m_link).m_pNext = &pCond->m_link;
      }
      pCVar6 = &pCVar7->m_listEntryFree;
      if ((CNscPStackEntry *)pCVar6 == pCond) {
        pCVar6 = pCVar2;
      }
      pCVar2 = pCVar6->m_pNext;
      (pCond->m_link).m_pNext = pCVar2;
      (pCond->m_link).m_pPrev = pCVar6;
      pCVar6->m_pNext = &pCond->m_link;
      pCVar2->m_pPrev = &pCond->m_link;
    }
    if (this_00->m_nType == NscType_Unknown) {
      return this_00;
    }
    goto LAB_001522b2;
  }
  if (pCond == (CNscPStackEntry *)0x0) {
    local_38 = 0;
    local_40 = 0;
    psVar8 = (size_t *)0x0;
    bVar10 = 0;
    if (nToken == 0x128) {
LAB_001520d4:
      local_40 = local_38;
      CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorConditionalTokenRequiresInt,"case");
      NVar1 = this_00->m_nType;
joined_r0x001520ec:
      if (NVar1 != NscType_Unknown) {
LAB_001522b2:
        __assert_fail("m_nType == NscType_Unknown",
                      "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                      ,0xee,"void CNscPStackEntry::SetType(NscType)");
      }
      this_00->m_nType = NscType_Error;
      bVar10 = 1;
    }
  }
  else {
    if (pCond->m_nType == NscType_Error) {
      if (this_00->m_nType != NscType_Unknown) goto LAB_001522b2;
      this_00->m_nType = NscType_Error;
      goto LAB_001521bc;
    }
    psVar8 = (size_t *)pCond->m_pauchData;
    local_40 = pCond->m_nDataSize;
    local_38 = local_40;
    if (nToken == 0x128) {
      if (pCond->m_nType != NscType_Integer) goto LAB_001520d4;
      bVar10 = 1;
      if (this_00->m_nType != NscType_Error) {
        NscSimplifyConstant((uchar *)psVar8,&local_38);
        local_40 = local_38;
        if (((local_38 == 0) || (*psVar8 != local_38)) || ((int)psVar8[1] != 0x34)) {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorCaseValueNotConstant);
          NVar1 = this_00->m_nType;
          goto joined_r0x001520ec;
        }
      }
    }
    else {
      bVar10 = 0;
    }
  }
  if (this_00->m_nType != NscType_Error) {
    for (pNVar9 = g_pCtx->m_pCurrentFence; local_48 = psVar8, pNVar9 != (NscSymbolFence *)0x0;
        pNVar9 = pNVar9->pNext) {
      if (pNVar9->nFenceType != NscFenceType_Scope) {
        if (pNVar9->nFenceType == NscFenceType_Switch) {
          if (pNVar9->nLocals != 0) {
            pcVar5 = "case";
            if (nToken == 0x12a) {
              pcVar5 = "default";
            }
            CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorDeclarationSkippedByToken,pcVar5);
          }
          if (nToken == 0x12a) {
            if (pNVar9->fHasDefault == true) {
              CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorMultipleDefaultLabels);
              if (this_00->m_nType != NscType_Unknown) goto LAB_001522b2;
              this_00->m_nType = NscType_Error;
              goto LAB_001521b3;
            }
            pNVar9->fHasDefault = true;
            psVar8 = local_48;
          }
          else {
            local_4c = CNscPStackEntry::GetInteger(pCond);
            _Var4 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                              (*(undefined8 *)pNVar9->field_9,
                               *(undefined8 *)((long)pNVar9->field_9 + 8));
            psVar8 = local_48;
            this = pNVar9->field_9;
            __position._M_current = *(int **)((long)this + 8);
            if (_Var4._M_current == __position._M_current) {
              if (_Var4._M_current == *(int **)((long)this + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)this,__position,(int *)&local_4c);
              }
              else {
                *__position._M_current = local_4c;
                *(int **)((long)this + 8) = __position._M_current + 1;
              }
            }
            else {
              CNscContext::GenerateMessage
                        (g_pCtx,NscMessage_ErrorDuplicateCaseValue,(ulong)local_4c);
              psVar8 = local_48;
            }
          }
          if (this_00->m_nType == NscType_Error) goto LAB_001521b3;
          if (nToken != 0x12a && bVar10 == 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                          ,0x1652,"CNscPStackEntry *NscBuildCase(int, CNscPStackEntry *)");
          }
          CNscPStackEntry::PushCase
                    (this_00,NscPCode_Default - bVar10,(uchar *)psVar8,local_40,
                     g_pCtx->m_anFileNumbers[0],g_pCtx->m_anLineNumbers[0]);
          if (this_00->m_nType == NscType_Unknown) goto LAB_001521b3;
          goto LAB_001522b2;
        }
        break;
      }
    }
    CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningCaseDefaultOutsideSwitch);
  }
LAB_001521b3:
  pCVar7 = g_pCtx;
  if (pCond == (CNscPStackEntry *)0x0) {
    return this_00;
  }
LAB_001521bc:
  pCVar2 = (pCVar7->m_listEntryFree).m_pPrev;
  pCVar3 = (CNscPStackEntry *)(pCond->m_link).m_pNext;
  if (pCVar3 != pCond) {
    pCVar6 = (pCond->m_link).m_pPrev;
    (pCVar3->m_link).m_pPrev = pCVar6;
    pCVar6->m_pNext = (CNwnDoubleLinkList *)pCVar3;
    (pCond->m_link).m_pNext = &pCond->m_link;
  }
  pCVar6 = &pCVar7->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar7->m_listEntryFree == pCond) {
    pCVar6 = pCVar2;
  }
  pCVar2 = pCVar6->m_pNext;
  (pCond->m_link).m_pNext = pCVar2;
  (pCond->m_link).m_pPrev = pCVar6;
  pCVar6->m_pNext = &pCond->m_link;
  pCVar2->m_pPrev = &pCond->m_link;
  return this_00;
}

Assistant:

YYSTYPE NscBuildCase (int nToken, YYSTYPE pCond)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pCond)
			g_pCtx ->FreePStackEntry (pCond);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}

	//
	// Check for silent errors
	//

	if (pCond != NULL && pCond ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, normal processing
	//

	else
	{

		//
		// Get the conditional
		//

		unsigned char *pauchCond = NULL;
		size_t nCondSize = 0;
		if (pCond)
		{
			pauchCond = pCond ->GetData ();
			nCondSize = pCond ->GetDataSize ();
		}

		//
		// If this is a case
		//

		if (nToken == CASE)
		{

			//
			// Validate the conditional
			//

			if (pCond == NULL || pCond ->GetType () != NscType_Integer)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorConditionalTokenRequiresInt,
					"case");
				pOut ->SetType (NscType_Error);
			}

			//
			// Make sure the conditional is constant.
			//
			// We have to make a special check for a negated integer
			// to support unoptimized Bioware script support.
			//

			if (pOut ->GetType () != NscType_Error)
			{
				
				//
				// Simplify the constant
				//

				NscSimplifyConstant (pauchCond, nCondSize);

				//
				// Not a simple constant integer
				//

				if (!CNscPStackEntry::IsSimpleConstant (pauchCond, nCondSize))
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorCaseValueNotConstant);
					pOut ->SetType (NscType_Error);
				}
			}
		}

		//
		// If we are still good
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Validate that the case or default is in a proper scope
			//

			NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
			while (pFence && pFence ->nFenceType == NscFenceType_Scope)
				pFence = pFence ->pNext;
			if (pFence == NULL || pFence ->nFenceType != NscFenceType_Switch)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_WarningCaseDefaultOutsideSwitch);
				goto no_switch_fence;
				//pOut ->SetType (NscType_Error);
			}
			else
			{
				if (pFence ->nLocals != 0)
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorDeclarationSkippedByToken,
						(nToken == DEFAULT) ? "default" : "case");

				}
			}

			//
			// Test for only one default
			//

			if (nToken == DEFAULT)
			{
				if (pFence ->fHasDefault)
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorMultipleDefaultLabels);
					pOut ->SetType (NscType_Error);
				}
				else
					pFence ->fHasDefault = true;
			}
			else
			{

				//
				// Test for non-unique case scan value
				//

				int nCaseValue = pCond ->GetInteger ();

				if (std::find (
					pFence ->pSwitchCasesUsed ->begin (),
					pFence ->pSwitchCasesUsed ->end (),
					nCaseValue) != pFence ->pSwitchCasesUsed ->end ()) {

					g_pCtx ->GenerateMessage (
						NscMessage_ErrorDuplicateCaseValue,
						nCaseValue);
				}
				else
					pFence ->pSwitchCasesUsed ->push_back (nCaseValue);
			}
		}

		//
		// If we are still good
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Push the pcode
			//

			NscPCode nPCode;
			if (nToken == CASE)
				nPCode = NscPCode_Case;
			else if (nToken == DEFAULT)
				nPCode = NscPCode_Default;
			else
			{
				nPCode = NscPCode_Case;
				assert (false);
			}
			pOut ->PushCase (nPCode, pauchCond, nCondSize,
				g_pCtx ->GetFile (0), g_pCtx ->GetLine (0));

			//
			// Set the return type
			//

			pOut ->SetType (NscType_Unknown);
		}
	}

	//
	// Return results
	//

no_switch_fence:
	if (pCond)
        g_pCtx ->FreePStackEntry (pCond);
	return pOut;
}